

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

APInt __thiscall llvm::APIntOps::GreatestCommonDivisor(APIntOps *this,APInt *A,APInt *B)

{
  bool bVar1;
  uint uVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar3;
  APInt AVar4;
  uint Pow2_B;
  uint Pow2_A;
  uint Pow2;
  APInt *B_local;
  APInt *A_local;
  
  bVar1 = APInt::operator==(A,B);
  if (bVar1) {
    APInt::APInt((APInt *)this,A);
    uVar3 = extraout_RDX;
  }
  else {
    bVar1 = APInt::operator!(A);
    if (bVar1) {
      APInt::APInt((APInt *)this,B);
      uVar3 = extraout_RDX_00;
    }
    else {
      bVar1 = APInt::operator!(B);
      if (bVar1) {
        APInt::APInt((APInt *)this,A);
        uVar3 = extraout_RDX_01;
      }
      else {
        Pow2_B = APInt::countTrailingZeros(A);
        uVar2 = APInt::countTrailingZeros(B);
        if (uVar2 < Pow2_B) {
          APInt::lshrInPlace(A,Pow2_B - uVar2);
          Pow2_B = uVar2;
        }
        else if (Pow2_B < uVar2) {
          APInt::lshrInPlace(B,uVar2 - Pow2_B);
        }
        while (bVar1 = APInt::operator!=(A,B), bVar1) {
          bVar1 = APInt::ugt(A,B);
          if (bVar1) {
            APInt::operator-=(A,B);
            uVar2 = APInt::countTrailingZeros(A);
            APInt::lshrInPlace(A,uVar2 - Pow2_B);
          }
          else {
            APInt::operator-=(B,A);
            uVar2 = APInt::countTrailingZeros(B);
            APInt::lshrInPlace(B,uVar2 - Pow2_B);
          }
        }
        APInt::APInt((APInt *)this,A);
        uVar3 = extraout_RDX_02;
      }
    }
  }
  AVar4._8_8_ = uVar3;
  AVar4.U.pVal = (uint64_t *)this;
  return AVar4;
}

Assistant:

APInt llvm::APIntOps::GreatestCommonDivisor(APInt A, APInt B) {
  // Fast-path a common case.
  if (A == B) return A;

  // Corner cases: if either operand is zero, the other is the gcd.
  if (!A) return B;
  if (!B) return A;

  // Count common powers of 2 and remove all other powers of 2.
  unsigned Pow2;
  {
    unsigned Pow2_A = A.countTrailingZeros();
    unsigned Pow2_B = B.countTrailingZeros();
    if (Pow2_A > Pow2_B) {
      A.lshrInPlace(Pow2_A - Pow2_B);
      Pow2 = Pow2_B;
    } else if (Pow2_B > Pow2_A) {
      B.lshrInPlace(Pow2_B - Pow2_A);
      Pow2 = Pow2_A;
    } else {
      Pow2 = Pow2_A;
    }
  }

  // Both operands are odd multiples of 2^Pow_2:
  //
  //   gcd(a, b) = gcd(|a - b| / 2^i, min(a, b))
  //
  // This is a modified version of Stein's algorithm, taking advantage of
  // efficient countTrailingZeros().
  while (A != B) {
    if (A.ugt(B)) {
      A -= B;
      A.lshrInPlace(A.countTrailingZeros() - Pow2);
    } else {
      B -= A;
      B.lshrInPlace(B.countTrailingZeros() - Pow2);
    }
  }

  return A;
}